

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool anon_unknown.dwarf_faacfb::StaticLibraryCycle
               (cmGeneratorTarget *targetOrigin,cmGeneratorTarget *targetDepend,string *config)

{
  cmGeneratorTarget *this;
  bool bVar1;
  TargetType TVar2;
  reference ppcVar3;
  cmLinkImplementationLibraries *this_00;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar4;
  byte local_139;
  cmGeneratorTarget *local_100;
  cmGeneratorTarget *depTarget;
  cmLinkItem *item;
  const_iterator __end4;
  const_iterator __begin4;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range4;
  cmLinkImplementationLibraries *libs;
  cmGeneratorTarget *testTarget;
  undefined1 local_a8 [8];
  deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> testLibs;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  knownLibs;
  bool cycle;
  string *config_local;
  cmGeneratorTarget *targetDepend_local;
  cmGeneratorTarget *targetOrigin_local;
  
  knownLibs._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = false;
  config_local = (string *)targetDepend;
  targetDepend_local = targetOrigin;
  TVar2 = cmGeneratorTarget::GetType(targetOrigin);
  if ((TVar2 == STATIC_LIBRARY) &&
     (TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)config_local), TVar2 == STATIC_LIBRARY
     )) {
    std::
    set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
           *)&testLibs.
              super__Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
    std::deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::deque
              ((deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
               local_a8);
    std::
    set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::insert((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              *)&testLibs.
                 super__Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,(value_type *)&config_local);
    std::deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
              ((deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
               local_a8,(value_type *)&config_local);
    while (bVar1 = std::deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   ::empty((deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                            *)local_a8), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppcVar3 = std::deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                front((deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                       *)local_a8);
      this = *ppcVar3;
      std::deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::pop_front
                ((deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
                 local_a8);
      if (this == targetDepend_local) {
        knownLibs._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = true;
        break;
      }
      this_00 = cmGeneratorTarget::GetLinkImplementationLibraries(this,config,Link);
      if (this_00 != (cmLinkImplementationLibraries *)0x0) {
        __end4 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                           (&this_00->Libraries);
        item = (cmLinkItem *)
               std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                         (&this_00->Libraries);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                           *)&item), bVar1) {
          depTarget = (cmGeneratorTarget *)
                      __gnu_cxx::
                      __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                      ::operator*(&__end4);
          local_100 = *(cmGeneratorTarget **)&depTarget->ObjectDirectory;
          local_139 = 0;
          if (local_100 != (cmGeneratorTarget *)0x0) {
            TVar2 = cmGeneratorTarget::GetType(local_100);
            local_139 = 0;
            if (TVar2 == STATIC_LIBRARY) {
              pVar4 = std::
                      set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                      ::insert((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                                *)&testLibs.
                                   super__Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_100);
              local_139 = pVar4.second;
            }
          }
          if ((local_139 & 1) != 0) {
            std::deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            push_back((deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                       *)local_a8,&local_100);
          }
          __gnu_cxx::
          __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
          ::operator++(&__end4);
        }
      }
    }
    std::deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::~deque
              ((deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
               local_a8);
    std::
    set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            *)&testLibs.
               super__Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  return knownLibs._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
}

Assistant:

bool StaticLibraryCycle(cmGeneratorTarget const* targetOrigin,
                        cmGeneratorTarget const* targetDepend,
                        std::string const& config)
{
  bool cycle = false;
  if ((targetOrigin->GetType() == cmStateEnums::STATIC_LIBRARY) &&
      (targetDepend->GetType() == cmStateEnums::STATIC_LIBRARY)) {
    std::set<cmGeneratorTarget const*> knownLibs;
    std::deque<cmGeneratorTarget const*> testLibs;

    // Insert initial static_library dependency
    knownLibs.insert(targetDepend);
    testLibs.push_back(targetDepend);

    while (!testLibs.empty()) {
      cmGeneratorTarget const* testTarget = testLibs.front();
      testLibs.pop_front();
      // Check if the test target is the origin target (cycle)
      if (testTarget == targetOrigin) {
        cycle = true;
        break;
      }
      // Collect all static_library dependencies from the test target
      cmLinkImplementationLibraries const* libs =
        testTarget->GetLinkImplementationLibraries(
          config, cmGeneratorTarget::LinkInterfaceFor::Link);
      if (libs) {
        for (cmLinkItem const& item : libs->Libraries) {
          cmGeneratorTarget const* depTarget = item.Target;
          if (depTarget &&
              (depTarget->GetType() == cmStateEnums::STATIC_LIBRARY) &&
              knownLibs.insert(depTarget).second) {
            testLibs.push_back(depTarget);
          }
        }
      }
    }
  }
  return cycle;
}